

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

void __thiscall randomx::Instruction::print(Instruction *this,ostream *os)

{
  char *__s;
  size_t sVar1;
  code *UNRECOVERED_JUMPTABLE;
  long lVar2;
  
  __s = *(char **)(names + (ulong)this->opcode * 8);
  if (__s == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
  lVar2 = (ulong)this->opcode * 0x10;
  UNRECOVERED_JUMPTABLE = *(code **)(engine + lVar2);
  if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
    UNRECOVERED_JUMPTABLE =
         *(code **)(UNRECOVERED_JUMPTABLE +
                   *(long *)(&this->opcode + *(long *)(engine + lVar2 + 8)) + -1);
  }
  (*UNRECOVERED_JUMPTABLE)(&this->opcode + *(long *)(engine + lVar2 + 8),os);
  return;
}

Assistant:

void Instruction::print(std::ostream& os) const {
		os << names[opcode] << " ";
		auto handler = engine[opcode];
		(this->*handler)(os);
	}